

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,FunctionCallNode *node)

{
  bool bVar1;
  __optional_ne_t<TypeName,_TypeName> _Var2;
  int iVar3;
  string *psVar4;
  reference_wrapper<Symbol> *this_00;
  Symbol *pSVar5;
  _Optional_payload_base<TypeName> __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined4 extraout_var;
  size_type sVar7;
  size_type sVar8;
  undefined4 extraout_var_00;
  element_type *peVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  FunctionCallNode *in_RSI;
  SymbolTable *in_RDI;
  optional<std::reference_wrapper<Symbol>_> oVar11;
  TypeChecker typeChecker;
  shared_ptr<ExpressionNode> *arg;
  const_iterator __end2;
  const_iterator __begin2;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *__range2
  ;
  const_iterator expectedArgsIt;
  size_type nProvidedArgs;
  size_type nExpectedArgs;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *providedArgs;
  list<TypeName,_std::allocator<TypeName>_> expectedArgs;
  FunctionAnalyser analyser;
  optional<std::reference_wrapper<Symbol>_> symbol;
  string name;
  SymbolTable *in_stack_fffffffffffffc38;
  FunctionAnalyser *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  list<TypeName,_std::allocator<TypeName>_> *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc94;
  string *in_stack_fffffffffffffc98;
  TypeChecker local_278;
  reference local_260;
  _Self local_258;
  _Self local_250;
  undefined8 local_248;
  _List_const_iterator<TypeName> local_240 [15];
  Node *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  FunctionAnalyser local_c0 [2];
  _Storage<std::reference_wrapper<Symbol>,_true> local_40;
  undefined1 local_38;
  string local_30 [32];
  FunctionCallNode *local_10;
  
  local_10 = in_RSI;
  psVar4 = FunctionCallNode::getName_abi_cxx11_(in_RSI);
  std::__cxx11::string::string(local_30,(string *)psVar4);
  oVar11 = SymbolTable::lookup(in_RDI,in_stack_fffffffffffffc98,in_stack_fffffffffffffc94);
  local_40 = oVar11.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload;
  local_38 = oVar11.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::reference_wrapper<Symbol>_> *)0x14a7b1);
  if (!bVar1) {
    std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
    reportError(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  FunctionAnalyser::FunctionAnalyser(in_stack_fffffffffffffc40);
  this_00 = std::optional<std::reference_wrapper<Symbol>_>::value
                      ((optional<std::reference_wrapper<Symbol>_> *)in_stack_fffffffffffffc40);
  pSVar5 = std::reference_wrapper<Symbol>::get(this_00);
  (*pSVar5->_vptr_Symbol[2])(pSVar5,local_c0);
  bVar1 = FunctionAnalyser::isSymbolValid(local_c0);
  if (bVar1) {
    __lhs = (_Optional_payload_base<TypeName>)FunctionAnalyser::getReturnType(local_c0);
    bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x14a9b5);
    if (bVar1) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               FunctionAnalyser::getArguments_abi_cxx11_(local_c0);
      std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::list
                ((list<TypeName,_std::allocator<TypeName>_> *)pbVar6,in_stack_fffffffffffffc78);
      iVar3 = (*(local_10->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])();
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(extraout_var,iVar3);
      sVar7 = std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::size
                        ((list<TypeName,_std::allocator<TypeName>_> *)in_stack_fffffffffffffc40);
      sVar8 = std::__cxx11::
              list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              ::size((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                      *)in_stack_fffffffffffffc40);
      if (sVar7 != sVar8) {
        std::operator+((char *)__lhs,pbVar6);
        std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
        std::__cxx11::to_string((unsigned_long)pbVar10);
        std::operator+(pbVar10,in_stack_fffffffffffffc70);
        std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
        std::__cxx11::to_string((unsigned_long)pbVar10);
        std::operator+(pbVar10,in_stack_fffffffffffffc70);
        std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
        reportError(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      }
      local_240[0]._M_node =
           (_List_node_base *)
           std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::begin
                     ((list<TypeName,_std::allocator<TypeName>_> *)in_stack_fffffffffffffc38);
      iVar3 = (*(local_10->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])();
      local_248 = CONCAT44(extraout_var_00,iVar3);
      local_250._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
           ::begin((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                    *)in_stack_fffffffffffffc38);
      local_258._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
           ::end((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)in_stack_fffffffffffffc38);
      while (bVar1 = std::operator!=(&local_250,&local_258), bVar1) {
        local_260 = std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
                              ((_List_const_iterator<std::shared_ptr<ExpressionNode>_> *)
                               in_stack_fffffffffffffc40);
        peVar9 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x14ad2a);
        (*(peVar9->super_Node)._vptr_Node[2])(peVar9,in_RDI);
        TypeChecker::TypeChecker((TypeChecker *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38)
        ;
        peVar9 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x14ad62);
        (*(peVar9->super_Node)._vptr_Node[2])();
        TypeChecker::getType(&local_278);
        bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x14ad96);
        if (bVar1) {
          TypeChecker::getType(&local_278);
          std::_List_const_iterator<TypeName>::operator*
                    ((_List_const_iterator<TypeName> *)in_stack_fffffffffffffc40);
          _Var2 = std::operator!=((optional<TypeName> *)in_stack_fffffffffffffc40,
                                  (TypeName *)in_stack_fffffffffffffc38);
          if (_Var2) {
            std::operator+((char *)__lhs,pbVar6);
            std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
            std::_List_const_iterator<TypeName>::operator*
                      ((_List_const_iterator<TypeName> *)in_stack_fffffffffffffc40);
            std::
            unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc40,(key_type *)in_stack_fffffffffffffc38);
            std::operator+(in_stack_fffffffffffffc48,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc40);
            std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     TypeChecker::getType(&local_278);
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::optional<TypeName>::value
                                ((optional<TypeName> *)in_stack_fffffffffffffc40);
            std::
            unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)pbVar10,(key_type *)in_stack_fffffffffffffc38);
            std::operator+(pbVar6,pbVar10);
            std::operator+(pbVar6,(char *)pbVar10);
            reportError(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          }
        }
        std::_List_const_iterator<TypeName>::operator++(local_240,0);
        TypeChecker::~TypeChecker((TypeChecker *)0x14b01a);
        std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator++(&local_250);
      }
      std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::~list
                ((list<TypeName,_std::allocator<TypeName>_> *)0x14b048);
    }
    FunctionAnalyser::~FunctionAnalyser(in_stack_fffffffffffffc40);
    std::__cxx11::string::~string(local_30);
    return;
  }
  std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
  reportError(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
}

Assistant:

void SemanticAnalyser::visit(const FunctionCallNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name);
  if(!symbol)
    reportError("Calling undefined function named " + name + "!", node);

  FunctionAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Symbol " + name + " does not name a function!", node);

  /*
   * If user calls variable of type function, then analyser knows nothing about it's return type and arguments.
   * This is because variables' values are not being tracked.
   */
  if(analyser.getReturnType().has_value())
  {
    const auto expectedArgs = analyser.getArguments();
    const auto& providedArgs = node.getArguments();
    const auto nExpectedArgs = expectedArgs.size();
    const auto nProvidedArgs = providedArgs.size();

    if(nExpectedArgs != nProvidedArgs)
      reportError("Function " + name + " expected " +
        std::to_string(nExpectedArgs) + ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);

    auto expectedArgsIt = expectedArgs.begin();
    for(const auto& arg : node.getArguments())
    {
      arg->accept(*this);

      TypeChecker typeChecker{symbols_};
      arg->accept(typeChecker);
      if(typeChecker.getType().has_value() && typeChecker.getType() != *expectedArgsIt)
        reportError("Function " + name + " expected argument of type " + 
          TypeNameStrings.at(*expectedArgsIt) + ", but got " + 
            TypeNameStrings.at(typeChecker.getType().value()) + "!", node);
      
      expectedArgsIt++;
    }
  }
}